

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

const_iterator __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>,_unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>
::find(DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>,_unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>
       *this,const_arg_type_t<unsigned_long> Val)

{
  bool bVar1;
  DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *E;
  DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *local_30;
  DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *TheBucket;
  const_arg_type_t<unsigned_long> Val_local;
  DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>,_unsigned_long,_llvm::RelocAddrEntry,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::RelocAddrEntry>_>
  *this_local;
  
  TheBucket = (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)Val;
  Val_local = (const_arg_type_t<unsigned_long>)this;
  bVar1 = LookupBucketFor<unsigned_long>(this,Val,&local_30);
  if (bVar1) {
    E = getBucketsEnd(this);
    _this_local = makeConstIterator(this,local_30,E,(DebugEpochBase *)this,true);
  }
  else {
    _this_local = end(this);
  }
  return _this_local;
}

Assistant:

const_iterator find(const_arg_type_t<KeyT> Val) const {
    const BucketT *TheBucket;
    if (LookupBucketFor(Val, TheBucket))
      return makeConstIterator(TheBucket, getBucketsEnd(), *this, true);
    return end();
  }